

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::DescriptorPool::Tables::AddCheckpoint(Tables *this)

{
  CheckPoint local_2c;
  
  CheckPoint::CheckPoint(&local_2c,this);
  std::
  vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ::emplace_back<google::protobuf::DescriptorPool::Tables::CheckPoint>
            (&this->checkpoints_,&local_2c);
  return;
}

Assistant:

void DescriptorPool::Tables::AddCheckpoint() {
  checkpoints_.push_back(CheckPoint(this));
}